

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O1

void CompiledMixedType<int,signed_char>(void)

{
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  int ret;
  int local_3c;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_38;
  int local_34;
  
  local_38.m_int = 1;
  local_34 = CONCAT31(local_34._1_3_,1);
  local_3c = 0;
  DivisionHelper<int,_signed_char,_5>::
  DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_38.m_int,(char *)&local_34,&local_3c);
  local_3c = 0;
  local_34 = 1;
  DivisionHelper<int,_int,_5>::DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_38.m_int,&local_34,&local_3c);
  operator/('\x01',local_38);
  local_3c._0_1_ = 1;
  DivisionHelper<int,_signed_char,_5>::
  DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_38.m_int,(char *)&local_3c,&local_38.m_int);
  local_3c = CONCAT31(local_3c._1_3_,1);
  DivisionHelper<int,_signed_char,_5>::
  DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_38.m_int,(char *)&local_3c,&local_38.m_int);
  if ((0xfffffffeffffffff < (long)local_38.m_int - 0x7fffffffU) &&
     (local_38.m_int = local_38.m_int + 1, 0xfffffffeffffffff < (long)local_38.m_int - 0x7fffffffU))
  {
    local_38.m_int = 0;
    SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
              ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_38,'\x01'
              );
    SVar1 = SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
                      ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       &local_38,
                       (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                       0x1);
    operator<<(SVar1.m_int,
               (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
    SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
              ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_38,'\x01'
              );
    SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
              ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_38,
               (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
    SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
              ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_38,'\x01'
              );
    SVar1 = SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
                      ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       &local_38,
                       (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                       0x1);
    operator>>(SVar1.m_int,
               (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
    SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
              ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_38,'\x01'
              );
    SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
              ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_38,
               (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}